

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

int gotcha_strncmp(char *in_one,char *in_two,int max_length)

{
  int i;
  int max_length_local;
  char *in_two_local;
  char *in_one_local;
  
  i = 0;
  while( true ) {
    if (max_length <= i) {
      return 0;
    }
    if (in_one[i] == '\0') break;
    if (in_one[i] != in_two[i]) {
      return (int)in_one[i] - (int)in_two[i];
    }
    i = i + 1;
  }
  return (uint)(in_two[i] != '\0');
}

Assistant:

int gotcha_strncmp(const char *in_one, const char *in_two, int max_length)
{
  int i = 0;
  for (; i < max_length; i++) {
    if (in_one[i] == '\0') {
      return (in_two[i] == '\0') ? 0 : 1;
    }
    if (in_one[i] != in_two[i]) {
      return in_one[i] - in_two[i];
    }
  }
  return 0;
}